

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O2

void __thiscall front::symbolTable::SymbolTable::push_symbol(SymbolTable *this,SharedSyPtr *symbol)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  mapped_type *this_00;
  key_type local_60;
  string local_40 [32];
  
  peVar3 = (symbol->super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar1 = peVar3->_layerNum;
  std::__cxx11::string::string(local_40,(string *)&peVar3->_name);
  find_least_layer_symbol((SymbolTable *)&local_60,(string *)this);
  iVar2 = *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60._M_dataplus._M_p + 0x28)
                   )->_M_pi;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60._M_string_length);
  std::__cxx11::string::~string(local_40);
  if (iVar1 != iVar2) {
    std::
    vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
    ::push_back(&this->symbol_stack,symbol);
    std::__cxx11::string::string
              ((string *)&local_60,
               (string *)
               &((symbol->super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->_name);
    this_00 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->symbol_map,&local_60);
    std::
    vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
    ::push_back(this_00,symbol);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

void SymbolTable::push_symbol(SharedSyPtr symbol) {
  if (symbol->getLayerNum() !=
      find_least_layer_symbol(symbol->getName())->getLayerNum()) {
    symbol_stack.push_back(symbol);
    symbol_map[symbol->getName()].push_back(symbol);
  }
}